

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O3

void __thiscall flatfile_tests::flatfile_allocate::test_method(flatfile_allocate *this)

{
  long lVar1;
  path dir;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar4;
  undefined8 in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  _List in_stack_fffffffffffffd28;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined4 local_1dc;
  FlatFilePos local_1d8;
  assertion_result local_1d0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  FlatFilePos local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  bool out_of_space;
  undefined4 *local_160;
  undefined1 local_158 [16];
  undefined1 *local_148;
  undefined4 **local_140;
  FlatFilePos *local_138;
  assertion_result local_130;
  FlatFilePos **local_118;
  undefined4 **local_110;
  char *local_108;
  assertion_result local_100;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined8 local_d0;
  path local_c0;
  FlatFileSeq seq;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length = in_stack_fffffffffffffd10;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd08;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffd18;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffd20;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_fffffffffffffd28._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq,dir,(char *)&local_c0,0xe9eec7);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x63;
  file.m_begin = (iterator)&local_178;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae088;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined4 **)0xf73bdc;
  local_190.nFile = 0;
  local_190.nPos = 0;
  local_160 = (undefined4 *)FlatFileSeq::Allocate(&seq,&local_190,1,&out_of_space);
  local_110 = &local_160;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_160 == (undefined4 *)0x64);
  local_138 = &local_1d8;
  local_1d8.nFile = 100;
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_100.m_message.px = (element_type *)0xe9c6e5;
  local_d0 = &local_110;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae108;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,(lazy_ostream *)local_158,1,2,REQUIRE,0xe9c8d7,(size_t)&local_100,99,
             local_e8,"100U",&local_130);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x64;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1d8.nFile = 0;
  local_1d8.nPos = 0;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_1d8);
  local_190 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_160 = &local_1dc;
  local_1dc = 100;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_190 == (FlatFilePos)0x64);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (undefined4 **)0xe9c685;
  local_108 = "";
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae108;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_138 = &local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xe9c90d,(size_t)&local_110,100,
             &local_130,"100U",local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar4 = 0x3c286e;
  file_01.m_end = (iterator)0x65;
  file_01.m_begin = (iterator)&local_1f0;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_200,
             msg_01);
  local_130._0_8_ = CONCAT71(local_130._1_7_,out_of_space) ^ 1;
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!out_of_space";
  local_158._8_8_ = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = local_158;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_208 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_e8,1,0,WARN,_cVar4,(size_t)&local_210,0x65);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x67;
  file_02.m_begin = (iterator)&local_220;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_230,
             msg_02);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae088;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined4 **)0xf73bdc;
  local_190.nFile = 0;
  local_190.nPos = 99;
  local_160 = (undefined4 *)FlatFileSeq::Allocate(&seq,&local_190,1,&out_of_space);
  local_1d8 = (FlatFilePos)((ulong)local_1d8 & 0xffffffff00000000);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_160 == (undefined4 *)0x0);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_100.m_message.px = (element_type *)0xe9c6e5;
  local_110 = &local_160;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_1d8;
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae108;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_d0 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,(lazy_ostream *)local_158,1,2,REQUIRE,0xe9c94a,(size_t)&local_100,0x67,
             (lazy_ostream *)local_e8,"0U",&local_130);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000068;
  file_03.m_begin = (iterator)&local_240;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_250,
             msg_03);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1d8.nFile = 0;
  local_1d8.nPos = 99;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_1d8);
  local_190 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_1dc = 100;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_190 == (FlatFilePos)0x64);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (undefined4 **)0xe9c685;
  local_108 = "";
  local_138 = &local_190;
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_160 = &local_1dc;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae108;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xe9c97c,(size_t)&local_110,0x68,
             &local_130,"100U",(lazy_ostream *)local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar4 = 0x3c2cbd;
  file_04.m_end = (iterator)0x69;
  file_04.m_begin = (iterator)&local_260;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  local_130._0_8_ = CONCAT71(local_130._1_7_,out_of_space) ^ 1;
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!out_of_space";
  local_158._8_8_ = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_278 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_d0 = (lazy_ostream *)local_158;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_e8,1,0,WARN,_cVar4,(size_t)&local_280,0x69);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x6b;
  file_05.m_begin = (iterator)&local_290;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2a0,
             msg_05);
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae088;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined4 **)0xf73bdc;
  local_190.nFile = 0;
  local_190.nPos = 99;
  local_160 = (undefined4 *)FlatFileSeq::Allocate(&seq,&local_190,2,&out_of_space);
  local_1d8.nFile = 0x65;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_160 == (undefined4 *)0x65);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_100.m_message.px = (element_type *)0xe9c6e5;
  local_110 = &local_160;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_1d8;
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae108;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_d0 = &local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,(lazy_ostream *)local_158,1,2,REQUIRE,0xe9c9ac,(size_t)&local_100,0x6b,
             (lazy_ostream *)local_e8,"101U",&local_130);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x6c;
  file_06.m_begin = (iterator)&local_2b0;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c0,
             msg_06);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1d8.nFile = 0;
  local_1d8.nPos = 99;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_1d8);
  local_190 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_1dc = 200;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_190 == (FlatFilePos)0xc8);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (undefined4 **)0xe9c685;
  local_108 = "";
  local_138 = &local_190;
  local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
  local_130._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_130.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_160 = &local_1dc;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158._0_8_ = &PTR__lazy_ostream_013ae108;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xe9c97c,(size_t)&local_110,0x6c,
             &local_130,"200U",(lazy_ostream *)local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2c8 = "";
  _cVar4 = 0x3c30ef;
  file_07.m_end = (iterator)0x6d;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
             (size_t)&stack0xfffffffffffffd20,msg_07);
  local_130._0_8_ = CONCAT71(local_130._1_7_,out_of_space) ^ 1;
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158._0_8_ = "!out_of_space";
  local_158._8_8_ = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (lazy_ostream *)local_158;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_e8,1,0,WARN,_cVar4,(size_t)&stack0xfffffffffffffd10,
             0x6d);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_allocate)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 100);

    bool out_of_space;

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 0), 1, out_of_space), 100U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 0))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 1, out_of_space), 0U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 2, out_of_space), 101U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 200U);
    BOOST_CHECK(!out_of_space);
}